

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O1

__type __thiscall NS::wrap<int,char_const*>(NS *this,int first,char *rest)

{
  pointer ppNVar1;
  N *this_00;
  char *in_RCX;
  _Head_base<0UL,_N_*,_false> extraout_RDX;
  undefined4 in_register_00000034;
  __type _Var2;
  
  ppNVar1 = (pointer)N::operator_new(0x78,(NS *)CONCAT44(in_register_00000034,first));
  *ppNVar1 = (N *)0x0;
  ppNVar1[1] = (N *)0x0;
  ppNVar1[2] = (N *)0x0;
  ppNVar1[4] = (N *)0x0;
  ppNVar1[5] = (N *)0x0;
  ppNVar1[6] = (N *)0x0;
  ppNVar1[7] = (N *)0x0;
  ppNVar1[8] = (N *)0x0;
  ppNVar1[9] = (N *)0x0;
  *(int *)(ppNVar1 + 10) = (int)rest;
  *(undefined1 *)(ppNVar1 + 0xe) = 1;
  this_00 = (N *)N::operator_new(0x78,(NS *)CONCAT44(in_register_00000034,first));
  N::N<char_const*>(this_00,in_RCX);
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)this_00;
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = ppNVar1;
  _Var2.super__Tuple_impl<0UL,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  _Var2.super__Tuple_impl<0UL,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*>.
  super__Head_base<1UL,_N_*,_false>._M_head_impl =
       (_Head_base<1UL,_N_*,_false>)(_Head_base<1UL,_N_*,_false>)this;
  return (__type)_Var2.super__Tuple_impl<0UL,_N_*,_N_*>;
}

Assistant:

auto wrap(DataType first, Args  ... rest) {
        return std::tuple_cat(wrap(first), wrap(rest...));
    }